

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::lexically_relative(path *this,path *base)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  input_iterator_range<ghc::filesystem::path::iterator> *this_00;
  path *in_RDI;
  path *element_1;
  iterator __end2_1;
  iterator __begin2_1;
  input_iterator_range<ghc::filesystem::path::iterator> *__range2_1;
  int i;
  path *element;
  iterator __end2;
  iterator __begin2;
  input_iterator_range<ghc::filesystem::path::iterator> *__range2;
  int count;
  const_iterator b;
  const_iterator a;
  path *result;
  input_iterator_range<ghc::filesystem::path::iterator> *in_stack_fffffffffffff9b8;
  input_iterator_range<ghc::filesystem::path::iterator> *in_stack_fffffffffffff9c0;
  input_iterator_range<ghc::filesystem::path::iterator> *in_stack_fffffffffffff9d0;
  undefined7 in_stack_fffffffffffff9d8;
  byte in_stack_fffffffffffff9df;
  input_iterator_range<ghc::filesystem::path::iterator> *in_stack_fffffffffffff9e0;
  bool local_609;
  undefined2 in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa0a;
  undefined1 in_stack_fffffffffffffa0b;
  undefined1 in_stack_fffffffffffffa0c;
  undefined1 in_stack_fffffffffffffa0d;
  byte bVar4;
  undefined1 in_stack_fffffffffffffa0e;
  undefined1 in_stack_fffffffffffffa0f;
  bool local_5dc;
  bool local_5d9;
  bool local_5d1;
  iterator local_568 [3];
  path *in_stack_fffffffffffffb70;
  path *in_stack_fffffffffffffb78;
  int local_440;
  iterator local_358 [2];
  undefined1 local_2c8 [144];
  undefined1 *local_238;
  int local_22c;
  undefined4 local_228;
  byte local_221;
  byte local_189;
  iterator local_f8;
  iterator local_b0 [2];
  
  root_name((path *)CONCAT17(in_stack_fffffffffffffa0f,
                             CONCAT16(in_stack_fffffffffffffa0e,
                                      CONCAT15(in_stack_fffffffffffffa0d,
                                               CONCAT14(in_stack_fffffffffffffa0c,
                                                        CONCAT13(in_stack_fffffffffffffa0b,
                                                                 CONCAT12(in_stack_fffffffffffffa0a,
                                                                          in_stack_fffffffffffffa08)
                                                                ))))));
  root_name((path *)CONCAT17(in_stack_fffffffffffffa0f,
                             CONCAT16(in_stack_fffffffffffffa0e,
                                      CONCAT15(in_stack_fffffffffffffa0d,
                                               CONCAT14(in_stack_fffffffffffffa0c,
                                                        CONCAT13(in_stack_fffffffffffffa0b,
                                                                 CONCAT12(in_stack_fffffffffffffa0a,
                                                                          in_stack_fffffffffffffa08)
                                                                ))))));
  bVar1 = filesystem::operator!=
                    ((path *)in_stack_fffffffffffff9c0,(path *)in_stack_fffffffffffff9b8);
  local_5d1 = true;
  if (!bVar1) {
    bVar1 = is_absolute((path *)0x288e62);
    bVar2 = is_absolute((path *)0x288e78);
    local_5d1 = true;
    if (bVar1 == bVar2) {
      bVar1 = has_root_directory((path *)in_stack_fffffffffffff9d0);
      local_5d9 = false;
      if (!bVar1) {
        local_5d9 = has_root_directory((path *)in_stack_fffffffffffff9d0);
      }
      local_5d1 = local_5d9;
    }
  }
  ~path((path *)0x288ed3);
  ~path((path *)0x288ee0);
  if (local_5d1 == false) {
    begin((path *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
    begin((path *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
    while( true ) {
      local_189 = 0;
      end((path *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
      bVar1 = iterator::operator!=
                        (&in_stack_fffffffffffff9c0->_first,&in_stack_fffffffffffff9b8->_first);
      local_5dc = false;
      if (bVar1) {
        end((path *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
        local_189 = 1;
        bVar1 = iterator::operator!=
                          (&in_stack_fffffffffffff9c0->_first,&in_stack_fffffffffffff9b8->_first);
        local_5dc = false;
        if (bVar1) {
          iterator::operator*(local_b0);
          iterator::operator*(&local_f8);
          local_5dc = filesystem::operator==
                                ((path *)in_stack_fffffffffffff9c0,(path *)in_stack_fffffffffffff9b8
                                );
        }
      }
      if ((local_189 & 1) != 0) {
        iterator::~iterator((iterator *)0x289042);
      }
      iterator::~iterator((iterator *)0x28904f);
      if ((local_5dc & 1U) == 0) break;
      iterator::operator++(&in_stack_fffffffffffff9d0->_first);
      iterator::operator++(&in_stack_fffffffffffff9d0->_first);
    }
    local_221 = 0;
    end((path *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
    bVar1 = iterator::operator==
                      (&in_stack_fffffffffffff9c0->_first,&in_stack_fffffffffffff9b8->_first);
    bVar4 = false;
    if (bVar1) {
      end((path *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
      local_221 = 1;
      bVar4 = iterator::operator==
                        (&in_stack_fffffffffffff9c0->_first,&in_stack_fffffffffffff9b8->_first);
    }
    if ((local_221 & 1) != 0) {
      iterator::~iterator((iterator *)0x2891b8);
    }
    iterator::~iterator((iterator *)0x2891c5);
    if ((bVar4 & 1) == 0) {
      local_22c = 0;
      end((path *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
      input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                (in_stack_fffffffffffff9e0,
                 (iterator *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),
                 &in_stack_fffffffffffff9d0->_first);
      iterator::~iterator((iterator *)0x28929c);
      local_238 = local_2c8;
      input_iterator_range<ghc::filesystem::path::iterator>::begin(in_stack_fffffffffffff9b8);
      input_iterator_range<ghc::filesystem::path::iterator>::end(in_stack_fffffffffffff9b8);
      while (bVar1 = iterator::operator!=
                               (&in_stack_fffffffffffff9c0->_first,
                                &in_stack_fffffffffffff9b8->_first), bVar1) {
        this_00 = (input_iterator_range<ghc::filesystem::path::iterator> *)
                  iterator::operator*(local_358);
        bVar2 = false;
        bVar1 = false;
        path<char[2],ghc::filesystem::path>
                  ((path *)in_stack_fffffffffffff9e0,
                   (char (*) [2])CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),
                   (format)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
        bVar3 = filesystem::operator!=
                          ((path *)in_stack_fffffffffffff9c0,(path *)in_stack_fffffffffffff9b8);
        local_609 = false;
        if (bVar3) {
          path<char[1],ghc::filesystem::path>
                    ((path *)in_stack_fffffffffffff9e0,
                     (char (*) [1])CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),
                     (format)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
          bVar2 = true;
          bVar3 = filesystem::operator!=
                            ((path *)in_stack_fffffffffffff9c0,(path *)in_stack_fffffffffffff9b8);
          local_609 = false;
          if (bVar3) {
            in_stack_fffffffffffff9e0 = this_00;
            path<char[3],ghc::filesystem::path>
                      ((path *)this_00,
                       (char (*) [3])CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),
                       (format)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
            bVar1 = true;
            local_609 = filesystem::operator!=
                                  ((path *)in_stack_fffffffffffff9c0,
                                   (path *)in_stack_fffffffffffff9b8);
          }
        }
        in_stack_fffffffffffff9df = local_609;
        if (bVar1) {
          ~path((path *)0x2894e2);
          in_stack_fffffffffffff9df = local_609;
        }
        if (bVar2) {
          ~path((path *)0x2894fb);
        }
        ~path((path *)0x289508);
        if ((in_stack_fffffffffffff9df & 1) == 0) {
          path<char[3],ghc::filesystem::path>
                    ((path *)in_stack_fffffffffffff9e0,
                     (char (*) [3])CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),
                     (format)((ulong)this_00 >> 0x20));
          bVar1 = filesystem::operator==
                            ((path *)in_stack_fffffffffffff9c0,(path *)in_stack_fffffffffffff9b8);
          ~path((path *)0x2895c7);
          in_stack_fffffffffffff9d0 = this_00;
          if (bVar1) {
            local_22c = local_22c + -1;
          }
        }
        else {
          local_22c = local_22c + 1;
        }
        iterator::operator++(&in_stack_fffffffffffff9d0->_first);
      }
      local_228 = 4;
      iterator::~iterator((iterator *)0x28931d);
      iterator::~iterator((iterator *)0x28932a);
      input_iterator_range<ghc::filesystem::path::iterator>::~input_iterator_range
                (in_stack_fffffffffffff9c0);
      if (local_22c < 0) {
        path((path *)0x28963a);
      }
      else {
        path((path *)0x28965c);
        for (local_440 = 0; local_440 < local_22c; local_440 = local_440 + 1) {
          operator/=((path *)in_stack_fffffffffffff9c0,(char (*) [3])in_stack_fffffffffffff9b8);
        }
        end((path *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
        input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                  (in_stack_fffffffffffff9e0,
                   (iterator *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),
                   &in_stack_fffffffffffff9d0->_first);
        iterator::~iterator((iterator *)0x2896fb);
        input_iterator_range<ghc::filesystem::path::iterator>::begin(in_stack_fffffffffffff9b8);
        input_iterator_range<ghc::filesystem::path::iterator>::end(in_stack_fffffffffffff9b8);
        while (bVar1 = iterator::operator!=
                                 (&in_stack_fffffffffffff9c0->_first,
                                  &in_stack_fffffffffffff9b8->_first), bVar1) {
          in_stack_fffffffffffff9c0 =
               (input_iterator_range<ghc::filesystem::path::iterator> *)
               iterator::operator*(local_568);
          operator/=(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
          iterator::operator++(&in_stack_fffffffffffff9d0->_first);
        }
        local_228 = 9;
        iterator::~iterator((iterator *)0x28977c);
        iterator::~iterator((iterator *)0x289789);
        input_iterator_range<ghc::filesystem::path::iterator>::~input_iterator_range
                  (in_stack_fffffffffffff9c0);
      }
    }
    else {
      path<char[2],ghc::filesystem::path>
                ((path *)in_stack_fffffffffffff9e0,
                 (char (*) [2])CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),
                 (format)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
    }
    local_228 = 1;
    iterator::~iterator((iterator *)0x2898bc);
    iterator::~iterator((iterator *)0x2898c9);
  }
  else {
    path((path *)0x288ef4);
  }
  return in_RDI;
}

Assistant:

GHC_INLINE path path::lexically_relative(const path& base) const
{
    if (root_name() != base.root_name() || is_absolute() != base.is_absolute() || (!has_root_directory() && base.has_root_directory())) {
        return path();
    }
    const_iterator a = begin(), b = base.begin();
    while (a != end() && b != base.end() && *a == *b) {
        ++a;
        ++b;
    }
    if (a == end() && b == base.end()) {
        return path(".");
    }
    int count = 0;
    for (const auto& element : input_iterator_range<const_iterator>(b, base.end())) {
        if (element != "." && element != "" && element != "..") {
            ++count;
        }
        else if (element == "..") {
            --count;
        }
    }
    if (count < 0) {
        return path();
    }
    path result;
    for (int i = 0; i < count; ++i) {
        result /= "..";
    }
    for (const auto& element : input_iterator_range<const_iterator>(a, end())) {
        result /= element;
    }
    return result;
}